

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O2

int sink_checkphi(jit_State *J,IRIns *ira,IRRef ref)

{
  IRIns *pIVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 1;
  if (0x8000 < ref) {
    pIVar1 = (J->cur).ir;
    uVar3 = (ulong)ref;
    if (((*(byte *)((long)pIVar1 + uVar3 * 8 + 4) & 0x40) != 0) ||
       (((*(char *)((long)pIVar1 + uVar3 * 8 + 5) == '[' &&
         (*(short *)((long)pIVar1 + uVar3 * 8 + 2) == 0x1d3)) &&
        ((*(byte *)((long)pIVar1 + (ulong)pIVar1[uVar3].field_0.op1 * 8 + 4) & 0x40) != 0)))) {
      (ira->field_0).prev = (ira->field_0).prev + 1;
      return uVar2;
    }
    uVar2 = 0;
    if (ref < J->loopref) {
      uVar2 = sink_phidep(J,ref);
      uVar2 = uVar2 ^ 1;
    }
  }
  return uVar2;
}

Assistant:

static int sink_checkphi(jit_State *J, IRIns *ira, IRRef ref)
{
  if (ref >= REF_FIRST) {
    IRIns *ir = IR(ref);
    if (irt_isphi(ir->t) || (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT &&
			     irt_isphi(IR(ir->op1)->t))) {
      ira->prev++;
      return 1;  /* Sinkable PHI. */
    }
    /* Otherwise the value must be loop-invariant. */
    return ref < J->loopref && !sink_phidep(J, ref);
  }
  return 1;  /* Constant (non-PHI). */
}